

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O1

ssize_t __thiscall
libtorrent::aux::part_file::read(part_file *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  int in_R8D;
  error_code *in_R9;
  error_code *ec;
  span<char> buf;
  file_handle f;
  unique_lock<std::mutex> l;
  undefined1 local_54 [32];
  key_type local_34;
  
  local_34.m_val = (int)__nbytes;
  local_54._12_8_ = &this->m_mutex;
  local_54[0x14] = '\0';
  ec = in_R9;
  local_54._4_8_ = __buf;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_54 + 0xc));
  local_54[0x14] = '\x01';
  p_Var3 = ::std::
           _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_piece_map)._M_h,
                      (ulong)(long)local_34.m_val % (this->m_piece_map)._M_h._M_bucket_count,
                      &local_34,(long)local_34.m_val);
  if (p_Var3 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var3->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    in_R9->val_ = 2;
    in_R9->failed_ = true;
    *(undefined3 *)&in_R9->field_0x5 = 0;
    in_R9->cat_ = &boost::system::detail::cat_holder<void>::generic_category_instance.
                   super_error_category;
    uVar2 = 0xffffffff;
  }
  else {
    iVar1 = *(int *)((long)&p_Var4[1]._M_nxt + 4);
    ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)(local_54 + 0xc));
    open_file((part_file *)local_54,(open_mode_t)(uint)this,(error_code *)&DAT_00000020);
    uVar2 = 0xffffffff;
    if (in_R9->failed_ == false) {
      buf.m_len = (long)in_R8D + (long)this->m_header_size + (long)this->m_piece_size * (long)iVar1;
      buf.m_ptr = (char *)local_54._4_8_;
      uVar2 = pread_all((aux *)(ulong)(uint)local_54._0_4_,__fd,buf,(int64_t)in_R9,ec);
    }
    file_handle::~file_handle((file_handle *)local_54);
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_54 + 0xc));
  return (ulong)uVar2;
}

Assistant:

int part_file::read(span<char> buf
		, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);
		std::unique_lock<std::mutex> l(m_mutex);

		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end())
		{
			ec = make_error_code(boost::system::errc::no_such_file_or_directory);
			return -1;
		}

		slot_index_t const slot = i->second;
		l.unlock();

		auto f = open_file(aux::open_mode::read_only | aux::open_mode::hidden, ec);
		if (ec) return -1;

		return int(aux::pread_all(f.fd(), buf, slot_offset(slot) + offset, ec));
	}